

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImGuiTextBuffer::ImGuiTextBuffer(ImGuiTextBuffer *this)

{
  value_type_conflict6 local_11;
  ImGuiTextBuffer *local_10;
  ImGuiTextBuffer *this_local;
  
  local_10 = this;
  ImVector<char>::ImVector(&this->Buf);
  local_11 = '\0';
  ImVector<char>::push_back(&this->Buf,&local_11);
  return;
}

Assistant:

ImGuiTextBuffer()   { Buf.push_back(0); }